

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s3_both.cc
# Opt level: O1

bool bssl::tls_add_message(SSL *ssl,Array<unsigned_char> *msg)

{
  buf_mem_st *pbVar1;
  SSL3_STATE *pSVar2;
  BUF_MEM *buf;
  SSL_HANDSHAKE *pSVar3;
  Span<const_unsigned_char> in;
  bool bVar4;
  int iVar5;
  BUF_MEM *__p;
  ulong uVar6;
  uchar *puVar7;
  size_t in_R8;
  size_t in_R9;
  uchar *puVar8;
  uchar *in_00;
  Span<const_unsigned_char> in_01;
  Span<const_unsigned_char> in_02;
  
  in_00 = msg->data_;
  puVar7 = (uchar *)msg->size_;
  iVar5 = SSL_is_quic(ssl);
  if ((iVar5 == 0) &&
     (((ssl->s3->aead_write_ctx)._M_t.
       super___uniq_ptr_impl<bssl::SSLAEADContext,_bssl::internal::Deleter>._M_t.
       super__Tuple_impl<0UL,_bssl::SSLAEADContext_*,_bssl::internal::Deleter>.
       super__Head_base<0UL,_bssl::SSLAEADContext_*,_false>._M_head_impl)->cipher_ ==
      (SSL_CIPHER *)0x0)) {
    do {
      if (puVar7 == (uchar *)0x0) {
LAB_00149a3a:
        in_02.size_ = in_R9;
        in_02.data_ = (uchar *)msg->size_;
        ssl_do_msg_callback((bssl *)ssl,(SSL *)0x1,0x16,(int)msg->data_,in_02);
        pSVar3 = (ssl->s3->hs)._M_t.
                 super___uniq_ptr_impl<bssl::SSL_HANDSHAKE,_bssl::internal::Deleter>._M_t.
                 super__Tuple_impl<0UL,_bssl::SSL_HANDSHAKE_*,_bssl::internal::Deleter>.
                 super__Head_base<0UL,_bssl::SSL_HANDSHAKE_*,_false>._M_head_impl;
        if ((pSVar3 != (SSL_HANDSHAKE *)0x0) &&
           (in.data_ = msg->data_, in.size_ = msg->size_,
           bVar4 = SSLTranscript::Update(&pSVar3->transcript,in), !bVar4)) {
          return false;
        }
        return true;
      }
      puVar8 = (uchar *)(ulong)ssl->max_send_fragment;
      if (puVar7 < (uchar *)(ulong)ssl->max_send_fragment) {
        puVar8 = puVar7;
      }
      puVar7 = puVar7 + -(long)puVar8;
      in_01.size_ = in_R8;
      in_01.data_ = puVar8;
      bVar4 = add_record_to_flight((bssl *)ssl,(SSL *)0x16,(uint8_t)in_00,in_01);
      in_00 = in_00 + (long)puVar8;
    } while (bVar4);
  }
  else {
    do {
      if (puVar7 == (uchar *)0x0) goto LAB_00149a3a;
      pbVar1 = (ssl->s3->pending_hs_data)._M_t.
               super___uniq_ptr_impl<buf_mem_st,_bssl::internal::Deleter>._M_t.
               super__Tuple_impl<0UL,_buf_mem_st_*,_bssl::internal::Deleter>.
               super__Head_base<0UL,_buf_mem_st_*,_false>._M_head_impl;
      if (((pbVar1 != (buf_mem_st *)0x0) && ((ulong)ssl->max_send_fragment <= pbVar1->length)) &&
         (bVar4 = tls_flush_pending_hs_data(ssl), !bVar4)) {
        return false;
      }
      pSVar2 = ssl->s3;
      pbVar1 = (pSVar2->pending_hs_data)._M_t.
               super___uniq_ptr_impl<buf_mem_st,_bssl::internal::Deleter>._M_t.
               super__Tuple_impl<0UL,_buf_mem_st_*,_bssl::internal::Deleter>.
               super__Head_base<0UL,_buf_mem_st_*,_false>._M_head_impl;
      if (pbVar1 == (buf_mem_st *)0x0) {
        uVar6 = 0;
      }
      else {
        uVar6 = pbVar1->length;
      }
      puVar8 = (uchar *)(ssl->max_send_fragment - uVar6);
      if (puVar7 < puVar8) {
        puVar8 = puVar7;
      }
      if (ssl->max_send_fragment == uVar6) {
        __assert_fail("!chunk.empty()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/s3_both.cc"
                      ,0x7a,"bool bssl::tls_add_message(SSL *, Array<uint8_t>)");
      }
      if (pbVar1 == (buf_mem_st *)0x0) {
        __p = BUF_MEM_new();
        std::__uniq_ptr_impl<buf_mem_st,_bssl::internal::Deleter>::reset
                  ((__uniq_ptr_impl<buf_mem_st,_bssl::internal::Deleter> *)&pSVar2->pending_hs_data,
                   (pointer)__p);
      }
      buf = (ssl->s3->pending_hs_data)._M_t.
            super___uniq_ptr_impl<buf_mem_st,_bssl::internal::Deleter>._M_t.
            super__Tuple_impl<0UL,_buf_mem_st_*,_bssl::internal::Deleter>.
            super__Head_base<0UL,_buf_mem_st_*,_false>._M_head_impl;
      if (buf == (BUF_MEM *)0x0) {
        return false;
      }
      puVar7 = puVar7 + -(long)puVar8;
      iVar5 = BUF_MEM_append(buf,in_00,(size_t)puVar8);
      in_00 = in_00 + (long)puVar8;
    } while (iVar5 != 0);
  }
  return false;
}

Assistant:

bool tls_add_message(SSL *ssl, Array<uint8_t> msg) {
  // Pack handshake data into the minimal number of records. This avoids
  // unnecessary encryption overhead, notably in TLS 1.3 where we send several
  // encrypted messages in a row. For now, we do not do this for the null
  // cipher. The benefit is smaller and there is a risk of breaking buggy
  // implementations.
  //
  // TODO(crbug.com/374991962): See if we can do this uniformly.
  Span<const uint8_t> rest = msg;
  if (!SSL_is_quic(ssl) && ssl->s3->aead_write_ctx->is_null_cipher()) {
    while (!rest.empty()) {
      Span<const uint8_t> chunk = rest.subspan(0, ssl->max_send_fragment);
      rest = rest.subspan(chunk.size());

      if (!add_record_to_flight(ssl, SSL3_RT_HANDSHAKE, chunk)) {
        return false;
      }
    }
  } else {
    while (!rest.empty()) {
      // Flush if |pending_hs_data| is full.
      if (ssl->s3->pending_hs_data &&
          ssl->s3->pending_hs_data->length >= ssl->max_send_fragment &&
          !tls_flush_pending_hs_data(ssl)) {
        return false;
      }

      size_t pending_len =
          ssl->s3->pending_hs_data ? ssl->s3->pending_hs_data->length : 0;
      Span<const uint8_t> chunk =
          rest.subspan(0, ssl->max_send_fragment - pending_len);
      assert(!chunk.empty());
      rest = rest.subspan(chunk.size());

      if (!ssl->s3->pending_hs_data) {
        ssl->s3->pending_hs_data.reset(BUF_MEM_new());
      }
      if (!ssl->s3->pending_hs_data ||
          !BUF_MEM_append(ssl->s3->pending_hs_data.get(), chunk.data(),
                          chunk.size())) {
        return false;
      }
    }
  }

  ssl_do_msg_callback(ssl, 1 /* write */, SSL3_RT_HANDSHAKE, msg);
  // TODO(svaldez): Move this up a layer to fix abstraction for SSLTranscript on
  // hs.
  if (ssl->s3->hs != NULL &&  //
      !ssl->s3->hs->transcript.Update(msg)) {
    return false;
  }
  return true;
}